

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteData(CWriter *this,char *src,size_t size)

{
  size_t size_local;
  char *src_local;
  CWriter *this_local;
  
  if ((this->should_write_indent_next_ & 1U) != 0) {
    WriteIndent(this);
    this->should_write_indent_next_ = false;
  }
  if ((size != 0) && (*src != '\n')) {
    this->consecutive_newline_count_ = 0;
  }
  Stream::WriteData(this->stream_,src,size,(char *)0x0,No);
  return;
}

Assistant:

void CWriter::WriteData(const char* src, size_t size) {
  if (should_write_indent_next_) {
    WriteIndent();
    should_write_indent_next_ = false;
  }
  if (size > 0 && src[0] != '\n') {
    consecutive_newline_count_ = 0;
  }
  stream_->WriteData(src, size);
}